

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_sadd_u8(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  c_v256 cVar13;
  c_v256 *in_RDI;
  undefined1 auVar14 [32];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[2];
  auVar9 = vpmovzxbd_avx2(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[3];
  auVar10 = vpmovzxbd_avx2(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = b.u64[2];
  auVar11 = vpmovzxbd_avx2(auVar3);
  auVar9 = vpaddd_avx2(auVar11,auVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b.u64[3];
  auVar11 = vpmovzxbd_avx2(auVar4);
  auVar10 = vpaddd_avx2(auVar11,auVar10);
  auVar14._8_4_ = 0xff;
  auVar14._0_8_ = 0xff000000ff;
  auVar14._12_4_ = 0xff;
  auVar14._16_4_ = 0xff;
  auVar14._20_4_ = 0xff;
  auVar14._24_4_ = 0xff;
  auVar14._28_4_ = 0xff;
  auVar10 = vpminud_avx2(auVar10,auVar14);
  auVar9 = vpminud_avx2(auVar9,auVar14);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = a.u64[0];
  auVar11 = vpmovzxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = a.u64[1];
  auVar12 = vpmovzxbd_avx2(auVar6);
  auVar9 = vpackusdw_avx2(auVar9,auVar10);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = b.u64[0];
  auVar10 = vpmovzxbd_avx2(auVar7);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = b.u64[1];
  auVar11 = vpmovzxbd_avx2(auVar8);
  auVar11 = vpaddd_avx2(auVar11,auVar12);
  auVar11 = vpminud_avx2(auVar11,auVar14);
  auVar10 = vpminud_avx2(auVar10,auVar14);
  auVar10 = vpackusdw_avx2(auVar10,auVar11);
  auVar9 = vpermq_avx2(auVar9,0xd8);
  auVar10 = vpermq_avx2(auVar10,0xd8);
  auVar9 = vpackuswb_avx2(auVar10,auVar9);
  cVar13 = (c_v256)vpermq_avx2(auVar9,0xd8);
  *in_RDI = cVar13;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_sadd_u8(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_sadd_u8(a.v128[1], b.v128[1]),
                          c_v128_sadd_u8(a.v128[0], b.v128[0]));
}